

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secure_erase.h
# Opt level: O0

void __thiscall
beast::detail::secure_erase_impl::impl::operator()(impl *this,void *dest,size_t bytes)

{
  bool bVar1;
  char *local_28;
  char *p;
  size_t bytes_local;
  void *dest_local;
  impl *this_local;
  
  local_28 = (char *)dest;
  p = (char *)bytes;
  if (bytes != 0) {
    do {
      *local_28 = '\0';
      bVar1 = false;
      if (*local_28 == '\0') {
        p = p + -1;
        bVar1 = p != (char *)0x0;
      }
      local_28 = local_28 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void operator()(
            void* dest, std::size_t bytes) const override
        {
            char volatile* volatile p =
                const_cast<volatile char*>(
                    reinterpret_cast<char*>(dest));
            if (bytes == 0)
                return;
            do
            {
                *p = 0;
            }
            while(*p++ == 0 && --bytes);
        }